

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Quaternion
QuaternionCubicHermiteSpline
          (Quaternion q1,Quaternion outTangent1,Quaternion q2,Quaternion inTangent2,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Quaternion QVar8;
  
  fVar3 = t * t;
  fVar6 = fVar3 * t;
  fVar4 = ((fVar6 + fVar6) - fVar3 * 3.0) + 1.0;
  fVar7 = fVar6 - fVar3;
  fVar2 = (fVar6 - (fVar3 + fVar3)) + t;
  fVar5 = fVar3 * 3.0 - (fVar6 + fVar6);
  fVar3 = inTangent2.x * fVar7 + q2.x * fVar5 + outTangent1.x * fVar2 + q1.x * fVar4;
  fVar1 = inTangent2.y * fVar7 + q2.y * fVar5 + outTangent1.y * fVar2 + q1.y * fVar4;
  fVar6 = inTangent2.z * fVar7 + q2.z * fVar5 + outTangent1.z * fVar2 + q1.z * fVar4;
  fVar4 = inTangent2.w * fVar7 + q2.w * fVar5 + outTangent1.w * fVar2 + q1.w * fVar4;
  fVar2 = fVar4 * fVar4 + fVar6 * fVar6 + fVar3 * fVar3 + fVar1 * fVar1;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  fVar2 = (float)(-(uint)(fVar2 == 0.0) & 0x3f800000 | ~-(uint)(fVar2 == 0.0) & (uint)(1.0 / fVar2))
  ;
  QVar8.y = fVar1 * fVar2;
  QVar8.x = fVar3 * fVar2;
  QVar8.w = fVar4 * fVar2;
  QVar8.z = fVar6 * fVar2;
  return QVar8;
}

Assistant:

RMAPI Quaternion QuaternionCubicHermiteSpline(Quaternion q1, Quaternion outTangent1, Quaternion q2, Quaternion inTangent2, float t)
{
    float t2 = t*t;
    float t3 = t2*t;
    float h00 = 2*t3 - 3*t2 + 1;
    float h10 = t3 - 2*t2 + t;
    float h01 = -2*t3 + 3*t2;
    float h11 = t3 - t2;

    Quaternion p0 = QuaternionScale(q1, h00);
    Quaternion m0 = QuaternionScale(outTangent1, h10);
    Quaternion p1 = QuaternionScale(q2, h01);
    Quaternion m1 = QuaternionScale(inTangent2, h11);

    Quaternion result = { 0 };

    result = QuaternionAdd(p0, m0);
    result = QuaternionAdd(result, p1);
    result = QuaternionAdd(result, m1);
    result = QuaternionNormalize(result);

    return result;
}